

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readRgbaFILE.cpp
# Opt level: O3

void readRgbaFILE(FILE *cfile,char *fileName,Array2D<Imf_3_4::Rgba> *pixels,int *width,int *height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  Rgba *pRVar6;
  long lVar7;
  int iVar8;
  RgbaInputFile file;
  C_IStream istr;
  Rgba local_a0 [8];
  undefined **local_60 [5];
  FILE *local_38;
  
  Imf_3_4::IStream::IStream((IStream *)local_60,fileName);
  local_60[0] = &PTR__IStream_0010dc70;
  local_38 = cfile;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_a0,(IStream *)local_60,iVar2);
  piVar4 = (int *)Imf_3_4::RgbaInputFile::dataWindow();
  iVar2 = *piVar4;
  iVar1 = piVar4[1];
  iVar8 = piVar4[3];
  *width = (piVar4[2] - iVar2) + 1;
  iVar3 = (iVar8 - iVar1) + 1;
  *height = iVar3;
  iVar8 = *width;
  lVar7 = (long)iVar8;
  uVar5 = lVar7 * iVar3;
  pRVar6 = (Rgba *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  if (pixels->_data != (Rgba *)0x0) {
    operator_delete__(pixels->_data);
    iVar8 = *width;
  }
  pixels->_sizeX = (long)iVar3;
  pixels->_sizeY = lVar7;
  pixels->_data = pRVar6;
  Imf_3_4::RgbaInputFile::setFrameBuffer
            (local_a0,(ulong)(pRVar6 + (-(long)iVar2 - (long)(iVar8 * iVar1))),1);
  Imf_3_4::RgbaInputFile::readPixels((int)local_a0,iVar1);
  Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_a0);
  Imf_3_4::IStream::~IStream((IStream *)local_60);
  return;
}

Assistant:

void
readRgbaFILE (
    FILE*          cfile,
    const char     fileName[],
    Array2D<Rgba>& pixels,
    int&           width,
    int&           height)
{
    C_IStream istr (cfile, fileName);

    RgbaInputFile file (istr);

    Box2i dw = file.dataWindow ();

    width  = dw.max.x - dw.min.x + 1;
    height = dw.max.y - dw.min.y + 1;
    pixels.resizeErase (height, width);

    file.setFrameBuffer (&pixels[0][0] - dw.min.x - dw.min.y * width, 1, width);

    file.readPixels (dw.min.y, dw.max.y);
}